

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_collection.cpp
# Opt level: O3

void __thiscall
duckdb::TupleDataCollection::Combine(TupleDataCollection *this,TupleDataCollection *other)

{
  pointer pLVar1;
  pointer pTVar2;
  idx_t iVar3;
  bool bVar4;
  InternalException *this_00;
  TupleDataSegment *other_seg;
  pointer rhs;
  pointer __args;
  pointer this_01;
  string local_50;
  
  if (other->count == 0) {
    return;
  }
  this_01 = (this->layout->types).
            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start;
  pLVar1 = (this->layout->types).
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  rhs = (other->layout->types).
        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_start;
  if ((long)pLVar1 - (long)this_01 ==
      (long)(other->layout->types).
            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)rhs) {
    if (this_01 != pLVar1) {
      do {
        bVar4 = LogicalType::operator==(this_01,rhs);
        if (!bVar4) break;
        this_01 = this_01 + 1;
        rhs = rhs + 1;
      } while (this_01 != pLVar1);
      if (!bVar4) goto LAB_012d1472;
    }
    ::std::vector<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>::reserve
              (&(this->segments).
                super_vector<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>,
               ((long)(other->segments).
                      super_vector<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>
                      .
                      super__Vector_base<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(other->segments).
                      super_vector<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>
                      .
                      super__Vector_base<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x2e8ba2e8ba2e8ba3 +
               ((long)(this->segments).
                      super_vector<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>
                      .
                      super__Vector_base<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->segments).
                      super_vector<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>
                      .
                      super__Vector_base<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x2e8ba2e8ba2e8ba3);
    pTVar2 = (other->segments).
             super_vector<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>.
             super__Vector_base<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__args = (other->segments).
                  super_vector<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>.
                  super__Vector_base<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>
                  ._M_impl.super__Vector_impl_data._M_start; __args != pTVar2; __args = __args + 1)
    {
      iVar3 = __args->data_size;
      this->count = this->count + __args->count;
      this->data_size = this->data_size + iVar3;
      ::std::vector<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>::
      emplace_back<duckdb::TupleDataSegment>
                (&(this->segments).
                  super_vector<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>,
                 __args);
    }
    Reset(other);
    return;
  }
LAB_012d1472:
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Attempting to combine TupleDataCollection with mismatching types",
             "");
  InternalException::InternalException(this_00,&local_50);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void TupleDataCollection::Combine(TupleDataCollection &other) {
	if (other.count == 0) {
		return;
	}
	if (this->layout.GetTypes() != other.GetLayout().GetTypes()) {
		throw InternalException("Attempting to combine TupleDataCollection with mismatching types");
	}
	this->segments.reserve(this->segments.size() + other.segments.size());
	for (auto &other_seg : other.segments) {
		AddSegment(std::move(other_seg));
	}
	other.Reset();
}